

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int read_data_compressed(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  rar *rar_00;
  long lVar1;
  int iVar2;
  int iVar3;
  uLong uVar4;
  int64_t iVar5;
  int local_70;
  int i;
  int length;
  int lzss_offset;
  int code;
  int sym;
  int ret;
  size_t bs;
  int64_t actualend;
  int64_t end;
  int64_t start;
  rar *rar;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  code = 0;
  rar_00 = (rar *)a->format->data;
  do {
    if (rar_00->valid == '\0') {
      return -0x1e;
    }
    if ((rar_00->ppmd_eod != '\0') ||
       ((rar_00->dictionary_size != 0 && (rar_00->unp_size <= rar_00->offset)))) {
      if (rar_00->unp_offset != 0) {
        *buff = rar_00->unp_buffer;
        *size = (ulong)rar_00->unp_offset;
        *offset = rar_00->offset_outgoing;
        rar_00->offset_outgoing = *size + rar_00->offset_outgoing;
        uVar4 = cm_zlib_crc32(rar_00->crc_calculated,(uchar *)*buff,(uint)*size);
        rar_00->crc_calculated = uVar4;
        rar_00->unp_offset = 0;
        return 0;
      }
      *buff = (void *)0x0;
      *size = 0;
      *offset = rar_00->offset;
      if (rar_00->file_crc != rar_00->crc_calculated) {
        archive_set_error(&a->archive,0x54,"File CRC error");
        return -0x1e;
      }
      rar_00->entry_eof = '\x01';
      return 1;
    }
    if (((rar_00->is_ppmd_block == '\0') && (rar_00->dictionary_size != 0)) &&
       (0 < rar_00->bytes_uncopied)) {
      if ((long)(ulong)(rar_00->unp_buffer_size - rar_00->unp_offset) < rar_00->bytes_uncopied) {
        _sym = (ulong)(rar_00->unp_buffer_size - rar_00->unp_offset);
      }
      else {
        _sym = rar_00->bytes_uncopied;
      }
      iVar2 = copy_from_lzss_window(a,buff,rar_00->offset,(int)_sym);
      if (iVar2 != 0) {
        return iVar2;
      }
      rar_00->offset = _sym + rar_00->offset;
      rar_00->bytes_uncopied = rar_00->bytes_uncopied - _sym;
      code = 0;
      if (*buff != (void *)0x0) {
        rar_00->unp_offset = 0;
        *size = (ulong)rar_00->unp_buffer_size;
        *offset = rar_00->offset_outgoing;
        rar_00->offset_outgoing = *size + rar_00->offset_outgoing;
        uVar4 = cm_zlib_crc32(rar_00->crc_calculated,(uchar *)*buff,(uint)*size);
        rar_00->crc_calculated = uVar4;
        return 0;
      }
    }
    else {
      if (((rar_00->br).next_in == (uchar *)0x0) &&
         (code = rar_br_preparation(a,&rar_00->br), code < -0x14)) {
        return code;
      }
      if ((rar_00->start_new_table != '\0') && (code = parse_codes(a), code < -0x14)) {
        return code;
      }
      if (rar_00->is_ppmd_block == '\0') {
        lVar1 = rar_00->offset;
        rar_00->filterstart = 0x7fffffffffffffff;
        iVar5 = expand(a,lVar1 + (ulong)rar_00->dictionary_size);
        if (iVar5 < 0) {
          return (int)iVar5;
        }
        rar_00->bytes_uncopied = iVar5 - lVar1;
        if (rar_00->bytes_uncopied == 0) {
          archive_set_error(&a->archive,0x54,"Internal error extracting RAR file");
          return -0x1e;
        }
      }
      else {
        iVar2 = Ppmd7_DecodeSymbol(&rar_00->ppmd7_context,&(rar_00->range_dec).p);
        if (iVar2 < 0) {
          archive_set_error(&a->archive,0x54,"Invalid symbol");
          return -0x1e;
        }
        if (iVar2 == rar_00->ppmd_escape) {
          iVar3 = Ppmd7_DecodeSymbol(&rar_00->ppmd7_context,&(rar_00->range_dec).p);
          if (iVar3 < 0) {
            archive_set_error(&a->archive,0x54,"Invalid symbol");
            return -0x1e;
          }
          switch(iVar3) {
          case 0:
            rar_00->start_new_table = '\x01';
            iVar2 = read_data_compressed(a,buff,size,offset);
            return iVar2;
          default:
            lzss_emit_literal(rar_00,(uint8_t)iVar2);
            rar_00->bytes_uncopied = rar_00->bytes_uncopied + 1;
            break;
          case 2:
            rar_00->ppmd_eod = '\x01';
            goto LAB_005ec979;
          case 3:
            archive_set_error(&a->archive,-1,"Parsing filters is unsupported.");
            return -0x19;
          case 4:
            i = 0;
            for (local_70 = 2; -1 < local_70; local_70 = local_70 + -1) {
              iVar2 = Ppmd7_DecodeSymbol(&rar_00->ppmd7_context,&(rar_00->range_dec).p);
              if (iVar2 < 0) {
                archive_set_error(&a->archive,0x54,"Invalid symbol");
                return -0x1e;
              }
              i = iVar2 << ((byte)(local_70 << 3) & 0x1f) | i;
            }
            iVar2 = Ppmd7_DecodeSymbol(&rar_00->ppmd7_context,&(rar_00->range_dec).p);
            if (iVar2 < 0) {
              archive_set_error(&a->archive,0x54,"Invalid symbol");
              return -0x1e;
            }
            lzss_emit_match(rar_00,i + 2,iVar2 + 0x20);
            rar_00->bytes_uncopied = (long)(iVar2 + 0x20) + rar_00->bytes_uncopied;
            break;
          case 5:
            iVar2 = Ppmd7_DecodeSymbol(&rar_00->ppmd7_context,&(rar_00->range_dec).p);
            if (iVar2 < 0) {
              archive_set_error(&a->archive,0x54,"Invalid symbol");
              return -0x1e;
            }
            lzss_emit_match(rar_00,1,iVar2 + 4);
            rar_00->bytes_uncopied = (long)(iVar2 + 4) + rar_00->bytes_uncopied;
          }
        }
        else {
          lzss_emit_literal(rar_00,(uint8_t)iVar2);
          rar_00->bytes_uncopied = rar_00->bytes_uncopied + 1;
        }
      }
      if ((long)(ulong)(rar_00->unp_buffer_size - rar_00->unp_offset) < rar_00->bytes_uncopied) {
        _sym = (ulong)(rar_00->unp_buffer_size - rar_00->unp_offset);
      }
      else {
        _sym = rar_00->bytes_uncopied;
      }
      iVar2 = copy_from_lzss_window(a,buff,rar_00->offset,(int)_sym);
      if (iVar2 != 0) {
        return iVar2;
      }
      rar_00->offset = _sym + rar_00->offset;
      rar_00->bytes_uncopied = rar_00->bytes_uncopied - _sym;
      code = 0;
    }
LAB_005ec979:
    if (*buff != (void *)0x0) {
      rar_00->unp_offset = 0;
      *size = (ulong)rar_00->unp_buffer_size;
      *offset = rar_00->offset_outgoing;
      rar_00->offset_outgoing = *size + rar_00->offset_outgoing;
      uVar4 = cm_zlib_crc32(rar_00->crc_calculated,(uchar *)*buff,(uint)*size);
      rar_00->crc_calculated = uVar4;
      return code;
    }
  } while( true );
}

Assistant:

static int
read_data_compressed(struct archive_read *a, const void **buff, size_t *size,
               int64_t *offset)
{
  struct rar *rar;
  int64_t start, end, actualend;
  size_t bs;
  int ret = (ARCHIVE_OK), sym, code, lzss_offset, length, i;

  rar = (struct rar *)(a->format->data);

  do {
    if (!rar->valid)
      return (ARCHIVE_FATAL);
    if (rar->ppmd_eod ||
       (rar->dictionary_size && rar->offset >= rar->unp_size))
    {
      if (rar->unp_offset > 0) {
        /*
         * We have unprocessed extracted data. write it out.
         */
        *buff = rar->unp_buffer;
        *size = rar->unp_offset;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
        /* Calculate File CRC. */
        rar->crc_calculated = crc32(rar->crc_calculated, *buff,
          (unsigned)*size);
        rar->unp_offset = 0;
        return (ARCHIVE_OK);
      }
      *buff = NULL;
      *size = 0;
      *offset = rar->offset;
      if (rar->file_crc != rar->crc_calculated) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "File CRC error");
        return (ARCHIVE_FATAL);
      }
      rar->entry_eof = 1;
      return (ARCHIVE_EOF);
    }

    if (!rar->is_ppmd_block && rar->dictionary_size && rar->bytes_uncopied > 0)
    {
      if (rar->bytes_uncopied > (rar->unp_buffer_size - rar->unp_offset))
        bs = rar->unp_buffer_size - rar->unp_offset;
      else
        bs = (size_t)rar->bytes_uncopied;
      ret = copy_from_lzss_window(a, buff, rar->offset, (int)bs);
      if (ret != ARCHIVE_OK)
        return (ret);
      rar->offset += bs;
      rar->bytes_uncopied -= bs;
      if (*buff != NULL) {
        rar->unp_offset = 0;
        *size = rar->unp_buffer_size;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
        /* Calculate File CRC. */
        rar->crc_calculated = crc32(rar->crc_calculated, *buff,
          (unsigned)*size);
        return (ret);
      }
      continue;
    }

    if (!rar->br.next_in &&
      (ret = rar_br_preparation(a, &(rar->br))) < ARCHIVE_WARN)
      return (ret);
    if (rar->start_new_table && ((ret = parse_codes(a)) < (ARCHIVE_WARN)))
      return (ret);

    if (rar->is_ppmd_block)
    {
      if ((sym = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
        &rar->ppmd7_context, &rar->range_dec.p)) < 0)
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Invalid symbol");
        return (ARCHIVE_FATAL);
      }
      if(sym != rar->ppmd_escape)
      {
        lzss_emit_literal(rar, sym);
        rar->bytes_uncopied++;
      }
      else
      {
        if ((code = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
          &rar->ppmd7_context, &rar->range_dec.p)) < 0)
        {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Invalid symbol");
          return (ARCHIVE_FATAL);
        }

        switch(code)
        {
          case 0:
            rar->start_new_table = 1;
            return read_data_compressed(a, buff, size, offset);

          case 2:
            rar->ppmd_eod = 1;/* End Of ppmd Data. */
            continue;

          case 3:
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
                              "Parsing filters is unsupported.");
            return (ARCHIVE_FAILED);

          case 4:
            lzss_offset = 0;
            for (i = 2; i >= 0; i--)
            {
              if ((code = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
                &rar->ppmd7_context, &rar->range_dec.p)) < 0)
              {
                archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                  "Invalid symbol");
                return (ARCHIVE_FATAL);
              }
              lzss_offset |= code << (i * 8);
            }
            if ((length = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
              &rar->ppmd7_context, &rar->range_dec.p)) < 0)
            {
              archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                "Invalid symbol");
              return (ARCHIVE_FATAL);
            }
            lzss_emit_match(rar, lzss_offset + 2, length + 32);
            rar->bytes_uncopied += length + 32;
            break;

          case 5:
            if ((length = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
              &rar->ppmd7_context, &rar->range_dec.p)) < 0)
            {
              archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                "Invalid symbol");
              return (ARCHIVE_FATAL);
            }
            lzss_emit_match(rar, 1, length + 4);
            rar->bytes_uncopied += length + 4;
            break;

         default:
           lzss_emit_literal(rar, sym);
           rar->bytes_uncopied++;
        }
      }
    }
    else
    {
      start = rar->offset;
      end = start + rar->dictionary_size;
      rar->filterstart = INT64_MAX;

      if ((actualend = expand(a, end)) < 0)
        return ((int)actualend);

      rar->bytes_uncopied = actualend - start;
      if (rar->bytes_uncopied == 0) {
          /* Broken RAR files cause this case.
          * NOTE: If this case were possible on a normal RAR file
          * we would find out where it was actually bad and
          * what we would do to solve it. */
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Internal error extracting RAR file");
          return (ARCHIVE_FATAL);
      }
    }
    if (rar->bytes_uncopied > (rar->unp_buffer_size - rar->unp_offset))
      bs = rar->unp_buffer_size - rar->unp_offset;
    else
      bs = (size_t)rar->bytes_uncopied;
    ret = copy_from_lzss_window(a, buff, rar->offset, (int)bs);
    if (ret != ARCHIVE_OK)
      return (ret);
    rar->offset += bs;
    rar->bytes_uncopied -= bs;
    /*
     * If *buff is NULL, it means unp_buffer is not full.
     * So we have to continue extracting a RAR file.
     */
  } while (*buff == NULL);

  rar->unp_offset = 0;
  *size = rar->unp_buffer_size;
  *offset = rar->offset_outgoing;
  rar->offset_outgoing += *size;
  /* Calculate File CRC. */
  rar->crc_calculated = crc32(rar->crc_calculated, *buff, (unsigned)*size);
  return ret;
}